

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereSphereCollisionAlgorithm.cpp
# Opt level: O1

cbtScalar __thiscall
cbtSphereSphereCollisionAlgorithm::calculateTimeOfImpact
          (cbtSphereSphereCollisionAlgorithm *this,cbtCollisionObject *col0,cbtCollisionObject *col1
          ,cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  return 1.0;
}

Assistant:

cbtScalar cbtSphereSphereCollisionAlgorithm::calculateTimeOfImpact(cbtCollisionObject* col0, cbtCollisionObject* col1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)col0;
	(void)col1;
	(void)dispatchInfo;
	(void)resultOut;

	//not yet
	return cbtScalar(1.);
}